

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotor.cpp
# Opt level: O3

void __thiscall chrono::ChShaftsMotor::ArchiveIN(ChShaftsMotor *this,ChArchiveIn *marchive)

{
  eCh_shaftsmotor_mode_mapper mmapper;
  ChEnumMapper<chrono::ChShaftsMotor::eCh_shaftsmotor_mode> local_78;
  eCh_shaftsmotor_mode_mapper local_58;
  char *local_38;
  undefined1 *local_30;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::ChShaftsMotor>(marchive);
  ChArchiveIn::VersionRead<chrono::ChShaftsMotorBase>(marchive);
  ChArchiveIn::VersionRead<chrono::ChShaftsCouple>(marchive);
  ChPhysicsItem::ArchiveIN((ChPhysicsItem *)this,marchive);
  my_enum_mappers::eCh_shaftsmotor_mode_mapper::eCh_shaftsmotor_mode_mapper(&local_58);
  my_enum_mappers::eCh_shaftsmotor_mode_mapper::operator()(&local_78,&local_58,&this->motor_mode);
  local_38 = "motor_mode";
  local_28 = 0;
  local_30 = (undefined1 *)&local_78;
  (**(code **)(*(long *)marchive + 0x58))(marchive);
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b23638
  ;
  if (local_78.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_78.value_ptr = (eCh_shaftsmotor_mode *)&this->motor_torque;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x96ab82;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive);
  local_78.value_ptr = (eCh_shaftsmotor_mode *)&this->motor_set_rot;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x96ab8f;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive);
  local_78.value_ptr = (eCh_shaftsmotor_mode *)&this->motor_set_rot_dt;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x96ab9d;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive);
  local_58.super_ChEnumMapper<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b23638;
  if (local_58.super_ChEnumMapper<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super_ChEnumMapper<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ChShaftsMotor::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChShaftsMotor>();

    // deserialize parent class:
    ChShaftsMotorBase::ArchiveIN(marchive);

    // deserialize all member data:
    my_enum_mappers::eCh_shaftsmotor_mode_mapper mmapper;
    marchive >> CHNVP(mmapper(motor_mode), "motor_mode");
    marchive >> CHNVP(motor_torque);
    marchive >> CHNVP(motor_set_rot);
    marchive >> CHNVP(motor_set_rot_dt);
}